

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

int Aig_SupportSize(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int local_1c;
  Aig_Obj_t *pAStack_18;
  int Counter;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_1c = 0;
  pAStack_18 = pObj;
  pObj_local = (Aig_Obj_t *)p;
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x2f9,"int Aig_SupportSize(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsCo(pAStack_18);
  if (iVar1 == 0) {
    Aig_ManIncrementTravId((Aig_Man_t *)pObj_local);
    Aig_SupportSize_rec((Aig_Man_t *)pObj_local,pAStack_18,&local_1c);
    return local_1c;
  }
  __assert_fail("!Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                ,0x2fa,"int Aig_SupportSize(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

int Aig_SupportSize( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    int Counter = 0;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCo(pObj) );
    Aig_ManIncrementTravId( p );
    Aig_SupportSize_rec( p, pObj, &Counter );
    return Counter;
}